

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

xml_parse_result * __thiscall
NULLCPugiXML::xml_document__load
          (NULLCPugiXML *this,NULLCArray contents,uint options,xml_document *document)

{
  long *plVar1;
  xml_document *this_00;
  xml_parse_result *pxVar2;
  undefined4 in_register_0000000c;
  xml_parse_result local_40;
  
  plVar1 = *(long **)CONCAT44(in_register_0000000c,options);
  if (plVar1 == (long *)0x0) {
    pxVar2 = (xml_parse_result *)0x0;
    nullcThrowError("xml_document constructor wasn\'t called",contents.ptr);
  }
  else {
    this_00 = (xml_document *)*plVar1;
    if (this_00 == (xml_document *)0x0) {
      this_00 = (xml_document *)nullcAllocate(0xd0);
      **(undefined8 **)CONCAT44(in_register_0000000c,options) = this_00;
      pugi::xml_document::xml_document(this_00);
    }
    pxVar2 = (xml_parse_result *)nullcAllocate(0xc);
    pugi::xml_document::load_string(&local_40,this_00,(char_t *)this,contents.len);
    pxVar2->status = local_40.status;
    pxVar2->offset = (int)local_40.offset;
    pxVar2->encoding = local_40.encoding;
  }
  return pxVar2;
}

Assistant:

xml_parse_result* xml_document__load(NULLCArray contents, unsigned int options, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_string(contents.ptr, options);
		return res;
	}